

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_351f5::ArenaTest_SizedFree_Test::TestBody(ArenaTest_SizedFree_Test *this)

{
  _Bool _Var1;
  upb_Arena *a;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  SizeTracker alloc;
  char initial_block [1000];
  AssertHelper local_460;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_458;
  internal local_450 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_448;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  local_440;
  upb_alloc local_420;
  upb_alloc *local_418;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  *local_410;
  undefined1 local_408 [1008];
  
  local_410 = &local_440;
  local_440.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       1;
  local_440.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_420.func = size_checking_allocfunc;
  local_418 = &upb_alloc_global;
  a = upb_Arena_Init(local_408,1000,&local_420);
  pcVar3 = a->ptr_dont_copy_me__upb_internal_use_only;
  pcVar2 = a->end_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)pcVar2 - (long)pcVar3) < 0x1f8) {
    _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,0x1f8);
    pcVar3 = a->ptr_dont_copy_me__upb_internal_use_only;
    pcVar2 = a->end_dont_copy_me__upb_internal_use_only;
  }
  else {
    if ((char *)((ulong)(pcVar3 + 7) & 0xfffffffffffffff8) != pcVar3) goto LAB_00174325;
    pcVar3 = pcVar3 + 0x1f8;
    a->ptr_dont_copy_me__upb_internal_use_only = pcVar3;
  }
  if ((ulong)((long)pcVar2 - (long)pcVar3) < 2000) {
    pcVar3 = (char *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,2000);
  }
  else {
    if ((char *)((ulong)(pcVar3 + 7) & 0xfffffffffffffff8) != pcVar3) goto LAB_00174325;
    a->ptr_dont_copy_me__upb_internal_use_only = pcVar3 + 2000;
  }
  if (pcVar3 == (char *)0x0) {
    pcVar2 = a->ptr_dont_copy_me__upb_internal_use_only;
    pcVar4 = a->end_dont_copy_me__upb_internal_use_only;
  }
  else {
    pcVar2 = a->ptr_dont_copy_me__upb_internal_use_only;
    pcVar4 = a->end_dont_copy_me__upb_internal_use_only;
    if (1999 < (ulong)((long)pcVar4 - (long)(pcVar3 + 2000)) && pcVar3 + 2000 == pcVar2) {
      pcVar4 = pcVar2 + 2000;
      a->ptr_dont_copy_me__upb_internal_use_only = pcVar4;
      pcVar2 = pcVar3;
      goto LAB_00174103;
    }
  }
  if ((ulong)((long)pcVar4 - (long)pcVar2) < 4000) {
    pcVar2 = (char *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,4000);
  }
  else {
    if ((char *)((ulong)(pcVar2 + 7) & 0xfffffffffffffff8) != pcVar2) {
LAB_00174325:
      __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                    ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
    }
    a->ptr_dont_copy_me__upb_internal_use_only = pcVar2 + 4000;
  }
  if (pcVar2 == (char *)0x0) {
    __assert_fail("ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                  ,0x47,"void upb_Arena_ShrinkLast(struct upb_Arena *, void *, size_t, size_t)");
  }
  memcpy(pcVar2,pcVar3,2000);
  pcVar4 = a->ptr_dont_copy_me__upb_internal_use_only;
LAB_00174103:
  if (pcVar2 + 4000 == pcVar4) {
    a->ptr_dont_copy_me__upb_internal_use_only = pcVar2 + 8;
  }
  else {
    _Var1 = _upb_Arena_WasLastAlloc(a,pcVar2,4000);
    if (!_Var1) {
      __assert_fail("_upb_Arena_WasLastAlloc(a, ptr, oldsize)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                    ,0x58,"void upb_Arena_ShrinkLast(struct upb_Arena *, void *, size_t, size_t)");
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::AssertNotDebugCapacity(&local_440);
  local_458._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (local_440.settings_.
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_
       >> 1);
  local_460.data_._0_4_ = 0;
  testing::internal::CmpHelperGT<unsigned_long,int>
            (local_450,"sizes.size()","0",(unsigned_long *)&local_458,(int *)&local_460);
  if (local_450[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_458);
    if (local_448 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_448->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_460,(Message *)&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    if (local_458._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_458._M_head_impl + 8))();
    }
  }
  if (local_448 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_448,local_448);
  }
  upb_Arena_Free(a);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::AssertNotDebugCapacity(&local_440);
  local_458._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (local_440.settings_.
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_
       >> 1);
  local_460.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_450,"sizes.size()","0",(unsigned_long *)&local_458,(int *)&local_460);
  if (local_450[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_458);
    if (local_448 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_448->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=(&local_460,(Message *)&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    if (local_458._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_458._M_head_impl + 8))();
    }
  }
  if (local_448 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_448,local_448);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::destructor_impl(&local_440);
  return;
}

Assistant:

TEST(ArenaTest, SizedFree) {
  absl::flat_hash_map<void*, size_t> sizes;
  SizeTracker alloc;
  alloc.alloc.func = size_checking_allocfunc;
  alloc.delegate_alloc = &upb_alloc_global;
  alloc.sizes = &sizes;

  char initial_block[1000];

  upb_Arena* arena = upb_Arena_Init(initial_block, 1000, &alloc.alloc);
  (void)upb_Arena_Malloc(arena, 500);
  void* to_resize = upb_Arena_Malloc(arena, 2000);
  void* resized = upb_Arena_Realloc(arena, to_resize, 2000, 4000);
  upb_Arena_ShrinkLast(arena, resized, 4000, 1);
  EXPECT_GT(sizes.size(), 0);
  upb_Arena_Free(arena);
  EXPECT_EQ(sizes.size(), 0);
}